

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O2

Regexp * __thiscall
re2::Regexp::Walker<re2::Regexp_*>::WalkInternal
          (Walker<re2::Regexp_*> *this,Regexp *re,Regexp *top_arg,bool use_copy)

{
  stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
  *this_00;
  ushort uVar1;
  int iVar2;
  int iVar3;
  Regexp *pRVar4;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Elt_pointer pWVar6;
  Regexp **ppRVar7;
  Regexp *pRVar8;
  ulong uVar9;
  bool stop;
  undefined1 local_1b0 [40];
  Regexp **local_188;
  undefined4 extraout_var;
  
  Reset(this);
  if (re == (Regexp *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/re2-src/re2/walker-inl.h"
               ,0xa3);
    std::operator<<((ostream *)(local_1b0 + 8),"Walk NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
  }
  this_00 = &this->stack_;
  local_1b0._8_4_ = -1;
  local_188 = (Regexp **)0x0;
  local_1b0._0_8_ = re;
  local_1b0._16_8_ = top_arg;
  std::deque<re2::WalkState<re2::Regexp*>,std::allocator<re2::WalkState<re2::Regexp*>>>::
  emplace_back<re2::WalkState<re2::Regexp*>>
            ((deque<re2::WalkState<re2::Regexp*>,std::allocator<re2::WalkState<re2::Regexp*>>> *)
             this_00,(WalkState<re2::Regexp_*> *)local_1b0);
  do {
    while( true ) {
      pWVar6 = (this->stack_).c.
               super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar6 == (this->stack_).c.
                    super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar6 = (this->stack_).c.
                 super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
      }
      pRVar8 = pWVar6[-1].re;
      uVar9 = (ulong)(uint)pWVar6[-1].n;
      if (pWVar6[-1].n != 0xffffffff) break;
      iVar3 = this->max_visits_;
      this->max_visits_ = iVar3 + -1;
      if (iVar3 < 1) {
        this->stopped_early_ = true;
        iVar3 = (*this->_vptr_Walker[5])(this,pRVar8,pWVar6[-1].parent_arg);
        pRVar4 = (Regexp *)CONCAT44(extraout_var_02,iVar3);
      }
      else {
        local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
        iVar3 = (*this->_vptr_Walker[2])(this,pRVar8,pWVar6[-1].parent_arg,local_1b0);
        pRVar4 = (Regexp *)CONCAT44(extraout_var,iVar3);
        pWVar6[-1].pre_arg = pRVar4;
        if (local_1b0[0] == false) {
          pWVar6[-1].n = 0;
          pWVar6[-1].child_args = (Regexp **)0x0;
          uVar1 = pRVar8->nsub_;
          uVar9 = (ulong)uVar1;
          if (uVar1 != 0) {
            if (uVar1 == 1) {
              pWVar6[-1].child_args = &pWVar6[-1].child_arg;
              uVar9 = 0;
            }
            else {
              ppRVar7 = (Regexp **)operator_new__((ulong)uVar1 << 3);
              pWVar6[-1].child_args = ppRVar7;
              uVar9 = (ulong)(uint)pWVar6[-1].n;
            }
          }
          break;
        }
      }
LAB_001e46f2:
      std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>::
      pop_back(&this_00->c);
      pWVar6 = (this->stack_).c.
               super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar6 == (this->stack_).c.
                    super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        return pRVar4;
      }
      if (pWVar6 == (this->stack_).c.
                    super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar6 = (this->stack_).c.
                 super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
      }
      if (pWVar6[-1].child_args == (Regexp **)0x0) {
        pWVar6[-1].child_arg = pRVar4;
        iVar3 = pWVar6[-1].n;
      }
      else {
        iVar3 = pWVar6[-1].n;
        pWVar6[-1].child_args[iVar3] = pRVar4;
      }
      pWVar6[-1].n = iVar3 + 1;
    }
    uVar1 = pRVar8->nsub_;
    if (uVar1 == 0) {
LAB_001e46a2:
      iVar3 = (*this->_vptr_Walker[3])
                        (this,pRVar8,pWVar6[-1].parent_arg,pWVar6[-1].pre_arg,pWVar6[-1].child_args)
      ;
      pRVar4 = (Regexp *)CONCAT44(extraout_var_01,iVar3);
      if ((1 < pRVar8->nsub_) && (pWVar6[-1].child_args != (Regexp **)0x0)) {
        operator_delete__(pWVar6[-1].child_args);
      }
      goto LAB_001e46f2;
    }
    if (uVar1 == 1) {
      paVar5 = &pRVar8->field_5;
    }
    else {
      paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar8->field_5).submany_;
    }
    iVar3 = (int)uVar9;
    if ((int)(uint)uVar1 <= iVar3) goto LAB_001e46a2;
    if (use_copy && 0 < iVar3) {
      pRVar8 = (Regexp *)paVar5[uVar9].submany_;
      if ((Regexp *)paVar5[iVar3 - 1U].submany_ != pRVar8) goto LAB_001e4744;
      iVar2 = (*this->_vptr_Walker[4])(this,pWVar6[-1].child_args[iVar3 - 1U]);
      iVar3 = pWVar6[-1].n;
      pWVar6[-1].child_args[iVar3] = (Regexp *)CONCAT44(extraout_var_00,iVar2);
      pWVar6[-1].n = iVar3 + 1;
    }
    else {
      pRVar8 = (Regexp *)paVar5[iVar3].submany_;
LAB_001e4744:
      local_1b0._16_8_ = pWVar6[-1].pre_arg;
      local_1b0._8_4_ = -1;
      local_188 = (Regexp **)0x0;
      local_1b0._0_8_ = pRVar8;
      std::deque<re2::WalkState<re2::Regexp*>,std::allocator<re2::WalkState<re2::Regexp*>>>::
      emplace_back<re2::WalkState<re2::Regexp*>>
                ((deque<re2::WalkState<re2::Regexp*>,std::allocator<re2::WalkState<re2::Regexp*>>> *
                 )this_00,(WalkState<re2::Regexp_*> *)local_1b0);
    }
  } while( true );
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_.push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_.top();
    re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        FALLTHROUGH_INTENDED;
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_.push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_.top().
    // Update next guy down.
    stack_.pop();
    if (stack_.empty())
      return t;
    s = &stack_.top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}